

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmframe.cpp
# Opt level: O2

void __thiscall VMFrameStack::~VMFrameStack(VMFrameStack *this)

{
  BlockHeader *pBVar1;
  VMFrame *pVVar2;
  BlockHeader *pBVar3;
  
  do {
    pVVar2 = PopFrame(this);
  } while (pVVar2 != (VMFrame *)0x0);
  pBVar3 = this->Blocks;
  if (this->Blocks != (BlockHeader *)0x0) {
    while (pBVar3 != (BlockHeader *)0x0) {
      pBVar1 = pBVar3->NextBlock;
      operator_delete__(pBVar3);
      pBVar3 = pBVar1;
    }
  }
  pBVar3 = this->UnusedBlocks;
  if (this->UnusedBlocks != (BlockHeader *)0x0) {
    while (pBVar3 != (BlockHeader *)0x0) {
      pBVar1 = pBVar3->NextBlock;
      operator_delete__(pBVar3);
      pBVar3 = pBVar1;
    }
  }
  this->Blocks = (BlockHeader *)0x0;
  this->UnusedBlocks = (BlockHeader *)0x0;
  return;
}

Assistant:

VMFrameStack::~VMFrameStack()
{
	while (PopFrame() != NULL)
	{ }
	if (Blocks != NULL)
	{
		BlockHeader *block, *next;
		for (block = Blocks; block != NULL; block = next)
		{
			next = block->NextBlock;
			delete[] (VM_UBYTE *)block;
		}
	}
	if (UnusedBlocks != NULL)
	{
		BlockHeader *block, *next;
		for (block = UnusedBlocks; block != NULL; block = next)
		{
			next = block->NextBlock;
			delete[] (VM_UBYTE *)block;
		}
	}
	Blocks = NULL;
	UnusedBlocks = NULL;
}